

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O1

bool __thiscall
Lib::
SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListIntermediateNode::NodePtrComparator>
::getPosition<Kernel::TermList::Top>
          (SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListIntermediateNode::NodePtrComparator>
           *this,Top key,Node ***pvalue,bool canCreate)

{
  Top key_00;
  Comparison CVar1;
  Node **ppNVar2;
  int iVar3;
  uint uVar4;
  byte unaff_R13B;
  Node *pNVar5;
  Node *pNVar6;
  Top TVar7;
  Top local_58;
  SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListIntermediateNode::NodePtrComparator>
  *local_48;
  Top local_40;
  
  TVar7._inner._inner._0_8_ = key._inner._inner._0_8_;
  local_58._inner._inner._content[7] = key._inner._inner._content[7];
  *pvalue = (Node **)0x0;
  local_58._inner._inner._0_8_ = TVar7._inner._inner._0_8_;
  if (this->_top == 0) {
    if (canCreate) {
      TVar7._inner._inner._8_4_ = key._inner._inner._8_4_ & 0xff;
      ppNVar2 = (Node **)insertPositionRaw<Kernel::TermList::Top>(this,TVar7);
      *ppNVar2 = (Node *)0x0;
      *pvalue = ppNVar2;
    }
    unaff_R13B = 0;
  }
  else {
    uVar4 = this->_top - 1;
    pNVar5 = this->_left;
    local_48 = this;
    do {
      pNVar6 = pNVar5->nodes[uVar4];
      if (pNVar6 == (Node *)0x0) {
        if (uVar4 == 0) {
LAB_00348c0d:
          if (canCreate) {
            key_00._inner._inner._content[7] = local_58._inner._inner._content[7];
            key_00._inner._inner._9_3_ = local_58._inner._inner._9_3_;
            key_00._inner._inner._0_1_ = local_58._inner._inner._0_1_;
            key_00._inner._inner._content[0] = local_58._inner._inner._content[0];
            key_00._inner._inner._content[1] = local_58._inner._inner._content[1];
            key_00._inner._inner._content[2] = local_58._inner._inner._content[2];
            key_00._inner._inner._content[3] = local_58._inner._inner._content[3];
            key_00._inner._inner._content[4] = local_58._inner._inner._content[4];
            key_00._inner._inner._content[5] = local_58._inner._inner._content[5];
            key_00._inner._inner._content[6] = local_58._inner._inner._content[6];
            ppNVar2 = (Node **)insertPositionRaw<Kernel::TermList::Top>(local_48,key_00);
            *ppNVar2 = (Node *)0x0;
            *pvalue = ppNVar2;
          }
          uVar4 = 0;
          unaff_R13B = 0;
          pNVar6 = pNVar5;
          iVar3 = 1;
        }
        else {
          uVar4 = uVar4 - 1;
          pNVar6 = pNVar5;
          iVar3 = 3;
        }
      }
      else {
        TVar7 = Kernel::TermList::top(&pNVar6->value->_term);
        local_40._inner._inner._0_8_ = TVar7._inner._inner._0_8_;
        local_40._inner._inner._content[7] = TVar7._inner._inner._content[7];
        CVar1 = Kernel::TermList::Top::compare(&local_58,&local_40);
        iVar3 = 0;
        if (CVar1 != GREATER) {
          if (CVar1 == EQUAL) {
            *pvalue = &pNVar6->value;
            unaff_R13B = 1;
            pNVar6 = pNVar5;
            iVar3 = 1;
          }
          else {
            pNVar6 = pNVar5;
            iVar3 = 0;
            if (CVar1 == LESS) {
              if (uVar4 == 0) goto LAB_00348c0d;
              uVar4 = uVar4 - 1;
              iVar3 = 0;
            }
          }
        }
      }
      pNVar5 = pNVar6;
    } while ((iVar3 == 0) || (iVar3 == 3));
  }
  return (bool)(unaff_R13B & 1);
}

Assistant:

bool getPosition(Key key, Value*& pvalue, bool canCreate)
  {
    pvalue = nullptr;

    if(_top==0) {
      if(canCreate) {
	pvalue = insertPosition(key);
      }
      return false;
    }

    unsigned h = _top-1;

   // left is a node with a value smaller than that of newNode and having
    // a large enough height.
    // this node is on the left of the inserted one
    Node* left = _left;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	if (h == 0) {
	    if(canCreate) {
	      pvalue=insertPosition(key);
	    }
	    return false;
	}
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  // the node should be inserted on the left
	  if (h == 0) {
	    if(canCreate) {
	      pvalue=insertPosition(key);
	    }
	    return false;
	  }
	  h--;
	  break;

	case EQUAL:
	  pvalue=&next->value;
	  return true;

	case GREATER:
	  left = next;
	  break;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }